

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_asymmetric_decrypt
          (psa_key_handle_t handle,psa_algorithm_t alg,uint8_t *input,size_t input_length,
          uint8_t *salt,size_t salt_length,uint8_t *output,size_t output_size,size_t *output_length)

{
  mbedtls_rsa_context *ctx;
  uint8_t *puVar1;
  uint8_t *puVar2;
  int local_5c;
  int ret;
  mbedtls_rsa_context *rsa;
  psa_key_slot_t *ppStack_48;
  psa_status_t status;
  psa_key_slot_t *slot;
  size_t salt_length_local;
  uint8_t *salt_local;
  size_t input_length_local;
  uint8_t *input_local;
  psa_key_handle_t local_16;
  psa_algorithm_t alg_local;
  psa_key_handle_t handle_local;
  
  *output_length = 0;
  if (((alg & 0xffffff00) == 0x12030000) || (salt_length == 0)) {
    slot = (psa_key_slot_t *)salt_length;
    salt_length_local = (size_t)salt;
    salt_local = (uint8_t *)input_length;
    input_length_local = (size_t)input;
    input_local._4_4_ = alg;
    local_16 = handle;
    alg_local = psa_get_key_from_slot(handle,&stack0xffffffffffffffb8,0x200,alg);
    puVar1 = salt_local;
    if (alg_local == 0) {
      if (((ppStack_48->attr).type & 0x7000) == 0x7000) {
        if ((ppStack_48->attr).type == 0x7001) {
          ctx = (ppStack_48->data).rsa;
          puVar2 = (uint8_t *)mbedtls_rsa_get_len(ctx);
          if (puVar1 == puVar2) {
            if (input_local._4_4_ == 0x12020000) {
              local_5c = mbedtls_rsa_pkcs1_decrypt
                                   (ctx,mbedtls_ctr_drbg_random,&global_data.ctr_drbg,1,
                                    output_length,(uchar *)input_length_local,output,output_size);
            }
            else {
              if ((input_local._4_4_ & 0xffffff00) != 0x12030000) {
                return -0x87;
              }
              psa_rsa_oaep_set_padding_mode(input_local._4_4_,ctx);
              local_5c = mbedtls_rsa_rsaes_oaep_decrypt
                                   (ctx,mbedtls_ctr_drbg_random,&global_data.ctr_drbg,1,
                                    (uchar *)salt_length_local,(size_t)slot,output_length,
                                    (uchar *)input_length_local,output,output_size);
            }
            alg_local = mbedtls_to_psa_error(local_5c);
          }
          else {
            alg_local = 0xffffff79;
          }
        }
        else {
          alg_local = 0xffffff7a;
        }
      }
      else {
        alg_local = 0xffffff79;
      }
    }
  }
  else {
    alg_local = 0xffffff79;
  }
  return alg_local;
}

Assistant:

psa_status_t psa_asymmetric_decrypt( psa_key_handle_t handle,
                                     psa_algorithm_t alg,
                                     const uint8_t *input,
                                     size_t input_length,
                                     const uint8_t *salt,
                                     size_t salt_length,
                                     uint8_t *output,
                                     size_t output_size,
                                     size_t *output_length )
{
    psa_key_slot_t *slot;
    psa_status_t status;

    (void) input;
    (void) input_length;
    (void) salt;
    (void) output;
    (void) output_size;

    *output_length = 0;

    if( ! PSA_ALG_IS_RSA_OAEP( alg ) && salt_length != 0 )
        return( PSA_ERROR_INVALID_ARGUMENT );

    status = psa_get_transparent_key( handle, &slot, PSA_KEY_USAGE_DECRYPT, alg );
    if( status != PSA_SUCCESS )
        return( status );
    if( ! PSA_KEY_TYPE_IS_KEY_PAIR( slot->attr.type ) )
        return( PSA_ERROR_INVALID_ARGUMENT );

#if defined(MBEDTLS_RSA_C)
    if( slot->attr.type == PSA_KEY_TYPE_RSA_KEY_PAIR )
    {
        mbedtls_rsa_context *rsa = slot->data.rsa;
        int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

        if( input_length != mbedtls_rsa_get_len( rsa ) )
            return( PSA_ERROR_INVALID_ARGUMENT );

#if defined(MBEDTLS_PKCS1_V15)
        if( alg == PSA_ALG_RSA_PKCS1V15_CRYPT )
        {
            ret = mbedtls_rsa_pkcs1_decrypt( rsa,
                                             mbedtls_ctr_drbg_random,
                                             &global_data.ctr_drbg,
                                             MBEDTLS_RSA_PRIVATE,
                                             output_length,
                                             input,
                                             output,
                                             output_size );
        }
        else
#endif /* MBEDTLS_PKCS1_V15 */
#if defined(MBEDTLS_PKCS1_V21)
        if( PSA_ALG_IS_RSA_OAEP( alg ) )
        {
            psa_rsa_oaep_set_padding_mode( alg, rsa );
            ret = mbedtls_rsa_rsaes_oaep_decrypt( rsa,
                                                  mbedtls_ctr_drbg_random,
                                                  &global_data.ctr_drbg,
                                                  MBEDTLS_RSA_PRIVATE,
                                                  salt, salt_length,
                                                  output_length,
                                                  input,
                                                  output,
                                                  output_size );
        }
        else
#endif /* MBEDTLS_PKCS1_V21 */
        {
            return( PSA_ERROR_INVALID_ARGUMENT );
        }

        return( mbedtls_to_psa_error( ret ) );
    }
    else
#endif /* defined(MBEDTLS_RSA_C) */
    {
        return( PSA_ERROR_NOT_SUPPORTED );
    }
}